

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

int find_rung_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object parent;
  Am_Value_List nodes;
  Am_Object local_30 [8];
  Am_Value_List local_28 [16];
  
  iVar4 = 0;
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PARENT);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  if (iVar3 != iVar2) {
    Am_Object::Get_Owner(local_30,(Am_Slot_Flags)self);
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_30,0x82);
    Am_Value_List::Am_Value_List(local_28,pAVar5);
    Am_Object::~Am_Object(local_30);
    cVar1 = Am_Value_List::Valid();
    iVar4 = 0;
    if (cVar1 != '\0') {
      pAVar5 = (Am_Value *)Am_Value_List::Get_Nth((int)local_28);
      Am_Object::Am_Object(local_30,pAVar5);
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_30,(ulong)RUNG);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      iVar4 = iVar4 + 1;
      Am_Object::~Am_Object(local_30);
    }
    Am_Value_List::~Am_Value_List(local_28);
  }
  return iVar4;
}

Assistant:

Am_Define_Formula(int, find_rung)
{
  int parent_rank = self.Get(PARENT);
  int rank = self.Get(Am_RANK);
  if (rank == parent_rank)
    return 0;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid()) {
    Am_Object parent = nodes.Get_Nth(parent_rank);
    int parent_rung = parent.Get(RUNG);
    return parent_rung + 1;
  }
  return 0;
}